

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

executor * __thiscall
spdlog::logger::log_it_(logger *this,log_msg *log_msg,bool log_enabled,bool traceback_enabled)

{
  undefined1 in_CL;
  logger *in_RDX;
  executor *in_RSI;
  executor *in_RDI;
  undefined1 in_R8B;
  undefined6 in_stack_ffffffffffffffe0;
  
  details::executor::executor
            (in_RSI,in_RDX,
             (log_msg *)
             (CONCAT17(in_CL,CONCAT16(in_R8B,in_stack_ffffffffffffffe0)) & 0x101ffffffffffff),
             SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
  return in_RDI;
}

Assistant:

SPDLOG_INLINE SPDLOG_EXECUTOR_T logger::log_it_(const spdlog::details::log_msg &log_msg, bool log_enabled, bool traceback_enabled)
{
#ifdef SPDLOG_JSON_LOGGER
    return spdlog::details::executor(this, log_msg, log_enabled, traceback_enabled);
#else
    executor_callback(log_msg, log_enabled, traceback_enabled);
    return SPDLOG_EXECUTOR_T{};
#endif
}